

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

float64 gauden_mixture(float64 **den,uint32 **den_idx,float32 **w,gauden_t *g)

{
  ulong uVar1;
  uint32 kk;
  ulong uVar2;
  float64 fVar3;
  float64 oprob;
  double dVar4;
  
  fVar3 = 1.0;
  for (uVar1 = 0; uVar1 != g->n_feat; uVar1 = uVar1 + 1) {
    dVar4 = 0.0;
    for (uVar2 = 0; g->n_top != uVar2; uVar2 = uVar2 + 1) {
      dVar4 = dVar4 + (double)(float)w[uVar1][den_idx[uVar1][uVar2]] * (double)den[uVar1][uVar2];
    }
    fVar3 = (float64)((double)fVar3 * dVar4);
  }
  return fVar3;
}

Assistant:

float64
gauden_mixture(float64 **den,
	       uint32 **den_idx,
	       float32 **w,
	       gauden_t *g)
{
    float64 out;
    uint32 j;

    out = 1.0;
    for (j = 0; j < g->n_feat; j++) {
	uint32 kk;
	float64 oprob;

	oprob = 0;
	kk = 0;
 	while (kk < g->n_top) {
	    uint32 k;
	    k = den_idx[j][kk];
	    oprob += w[j][k] * den[j][kk];
	    ++kk;
	}

	out *= oprob;
    }

    return out;
}